

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  symbolEncodingType_e sVar1;
  seqDef *psVar2;
  BYTE *codeTable;
  BYTE *codeTable_00;
  BYTE *codeTable_01;
  seqDef *psVar3;
  ZSTD_compressedBlockState_t *CTable;
  uint *count;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong nbSeq;
  ulong sourceSize;
  undefined4 in_stack_ffffffffffffffa8;
  uint maxSymbolValue;
  
  sVar4 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                     &(zc->blockSplitCtx).entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (sVar4 < 0xffffffffffffff89) {
    psVar2 = seqStore->sequences;
    sourceSize = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    codeTable_00 = seqStore->llCode;
    codeTable_01 = seqStore->mlCode;
    psVar3 = seqStore->sequencesStart;
    CTable = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    sVar1 = (zc->blockSplitCtx).entropyMetadata.hufMetadata.hType;
    maxSymbolValue = 0xff;
    if (sVar1 - set_compressed < 2) {
      sVar4 = HIST_count_wksp(count,(uint *)&stack0xffffffffffffffac,seqStore->litStart,sourceSize,
                              count,0x22d8);
      if (sVar4 < 0xffffffffffffff89) {
        sVar4 = HUF_estimateCompressedSize((HUF_CElt *)CTable,count,maxSymbolValue);
        if (sVar1 == set_compressed) {
          sVar4 = sVar4 + (zc->blockSplitCtx).entropyMetadata.hufMetadata.hufDesSize;
        }
        sVar5 = sVar4 + 6;
        if (sourceSize < 0x100) {
          sVar5 = sVar4;
        }
        sourceSize = ((ulong)(0x3ff < sourceSize) - (ulong)(sourceSize < 0x4000)) + 4 + sVar5;
      }
    }
    else if (sVar1 != set_basic) {
      if (sVar1 != set_rle) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xe6b,
                      "size_t ZSTD_estimateBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                     );
      }
      sourceSize = 1;
    }
    nbSeq = (long)psVar2 - (long)psVar3 >> 3;
    sVar4 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.ofType,codeTable,nbSeq,0x1f,
                       (CTable->entropy).fse.offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,count,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar5 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.llType,codeTable_00,nbSeq,
                       0x23,(CTable->entropy).fse.litlengthCTable,"",LL_defaultNorm,6,0x23,count,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar6 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.mlType,codeTable_01,nbSeq,
                       0x34,(CTable->entropy).fse.matchlengthCTable,"",ML_defaultNorm,6,0x34,count,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar4 = (zc->blockSplitCtx).entropyMetadata.fseMetadata.fseTablesSize +
            sVar4 + sourceSize + sVar5 + sVar6 + ((ulong)(0x7f < nbSeq) - (ulong)(nbSeq < 0x7f00)) +
            6;
  }
  return sVar4;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}